

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O3

char * __thiscall TadsXml::strip_xml_header(TadsXml *this,char *buf)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  
  pcVar3 = buf;
  while( true ) {
    cVar1 = *pcVar3;
    iVar2 = isspace((int)cVar1);
    if (((iVar2 == 0) && (cVar1 != '\r')) && (cVar1 != '\n')) break;
    pcVar3 = pcVar3 + 1;
  }
  iVar2 = memicmp(pcVar3,"<?xml ",6);
  if ((iVar2 == 0) && (cVar1 = pcVar3[6], cVar1 != '\0')) {
    pcVar3 = pcVar3 + 8;
    do {
      if ((cVar1 == '?') && (pcVar3[-1] == '>')) {
        for (; (*pcVar3 == '\r' || (*pcVar3 == '\n')); pcVar3 = pcVar3 + 1) {
        }
        return pcVar3;
      }
      cVar1 = pcVar3[-1];
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != '\0');
  }
  return buf;
}

Assistant:

const char *TadsXml::strip_xml_header(const char *buf)
{
    const char *p;

    /* skip any initial newlines or whitespace */
    for (p = buf ; isspace(*p) || *p == '\n' || *p == '\r' ; ++p) ;

    /* if it starts with "<?xml", find the end of the directive */
    if (memicmp(p, "<?xml ", 6) == 0)
    {
        int qu;

        /* scan for the matching '>' */
        for (p += 6, qu = 0 ; *p != '\0' ; ++p)
        {
            /* check for quotes */
            if (*p == '"' || *p == '\'')
            {
                /* 
                 *   if we're in a quoted section, and this is the matching
                 *   close quote, leave the quoted section; if we're not in a
                 *   quoted section, this is the opening quote of a quoted
                 *   section 
                 */
                if (qu == 0)
                {
                    /* we weren't in a quoted section, so now we are */
                    qu = *p;
                }
                else if (*p == qu)
                {
                    /* we were in a quoted section, and it's our close quote */
                    qu = 0;
                }
            }
            else if (*p == '?' && *(p+1) == '>')
            {
                /* 
                 *   It's the end of the directive.  Skip the "?>" sequence
                 *   and any subsequent newline characters.  
                 */
                for (p += 2 ; *p == '\n' || *p == '\r' ; ++p) ;

                /* 
                 *   we're now at the start of the XML contents - return the
                 *   current pointer 
                 */
                return p;
            }
        }
    }

    /* 
     *   we either didn't find the start of the <?XML?> directive, or we
     *   couldn't find the end of it - in either case, we don't have a
     *   well-formed directive, so there's nothing to strip: just return the
     *   original buffer 
     */
    return buf;
}